

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderTCTEDataPassThrough::deinitTestRun
          (TessellationShaderTCTEDataPassThrough *this,_run *run)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (run->fs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    run->fs_id = 0;
  }
  if (run->gs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    run->gs_id = 0;
  }
  if (run->po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    run->po_id = 0;
  }
  if (run->tcs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    run->tcs_id = 0;
  }
  if (run->tes_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    run->tes_id = 0;
  }
  if (run->vs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    run->vs_id = 0;
  }
  return;
}

Assistant:

void TessellationShaderTCTEDataPassThrough::deinitTestRun(_run& run)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (run.fs_id != 0)
	{
		gl.deleteShader(run.fs_id);

		run.fs_id = 0;
	}

	if (run.gs_id != 0)
	{
		gl.deleteShader(run.gs_id);

		run.gs_id = 0;
	}

	if (run.po_id != 0)
	{
		gl.deleteProgram(run.po_id);

		run.po_id = 0;
	}

	if (run.tcs_id != 0)
	{
		gl.deleteShader(run.tcs_id);

		run.tcs_id = 0;
	}

	if (run.tes_id != 0)
	{
		gl.deleteShader(run.tes_id);

		run.tes_id = 0;
	}

	if (run.vs_id != 0)
	{
		gl.deleteShader(run.vs_id);

		run.vs_id = 0;
	}
}